

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageBase.cpp
# Opt level: O0

void __thiscall MessageBase::warning(MessageBase *this,string *message)

{
  logger *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x318c08);
  spdlog::logger::warn<std::__cxx11::string>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void MessageBase::warning(const std::string& message) { logger->warn(message); }